

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_linear.hpp
# Opt level: O2

double sisl::tp_linear::phi<3>(vector *p)

{
  CoeffReturnType pdVar1;
  uint i;
  long index;
  double dVar2;
  
  dVar2 = 1.0;
  for (index = 0; index != 3; index = index + 1) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)p,index);
    dVar2 = dVar2 * (double)(-(ulong)(ABS(*pdVar1) <= 1.0) & (ulong)(1.0 - ABS(*pdVar1)));
  }
  return dVar2;
}

Assistant:

static const double phi(const vector &p) {
            double prod = 1;
            for(unsigned int i = 0; i < N; i++) prod *= bspline_1(p[i]);
            return prod;
        }